

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.c
# Opt level: O1

void aom_ifft_2d_gen(float *input,float *temp,float *output,int n,aom_fft_1d_func_t fft_single,
                    aom_fft_1d_func_t fft_multi,aom_fft_1d_func_t ifft_multi,
                    aom_fft_transpose_func_t transpose,int vec_size)

{
  uint uVar1;
  ulong uVar2;
  float *pfVar3;
  uint uVar4;
  uint uVar5;
  int iVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  float *pfVar12;
  long lVar13;
  int x;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  float fVar18;
  long local_c0;
  long local_b8;
  long local_a8;
  long local_a0;
  float *local_98;
  ulong uVar6;
  
  uVar4 = n / 2;
  uVar6 = (ulong)uVar4;
  lVar17 = (long)n;
  uVar16 = (ulong)(int)uVar4;
  if (-2 < n) {
    uVar14 = (ulong)(uVar4 + 1);
    iVar7 = 0;
    lVar8 = 0;
    do {
      *(float *)((long)output + lVar8) = input[iVar7];
      *(undefined4 *)((long)output + lVar8 + 4) =
           *(undefined4 *)((long)input + lVar8 * 2 + uVar16 * 8);
      lVar8 = lVar8 + lVar17 * 4;
      iVar7 = iVar7 + n * 2;
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
  }
  uVar1 = uVar4 + 1;
  if ((int)uVar1 < n) {
    lVar8 = (int)(uVar4 + 1) * lVar17;
    iVar7 = n * 2 + 1;
    lVar9 = ~uVar16 + lVar17;
    lVar13 = 0;
    do {
      *(float *)((long)output + lVar13 + lVar8 * 4) = input[iVar7];
      *(undefined4 *)((long)output + lVar13 + lVar8 * 4 + 4) =
           *(undefined4 *)((long)input + lVar13 * 2 + (uVar16 + lVar17) * 8 + 4);
      lVar13 = lVar13 + lVar17 * 4;
      iVar7 = iVar7 + n * 2;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  lVar8 = (long)vec_size;
  lVar9 = 0;
  pfVar3 = temp;
  pfVar12 = output;
  do {
    (*ifft_multi)(pfVar12,pfVar3,n);
    lVar9 = lVar9 + lVar8;
    pfVar12 = pfVar12 + lVar8;
    pfVar3 = pfVar3 + lVar8;
  } while (lVar9 < 2);
  uVar14 = (ulong)(uint)n;
  if (0 < n) {
    uVar2 = 2;
    if (2 < (int)uVar4) {
      uVar2 = uVar6;
    }
    pfVar3 = input + 3;
    lVar9 = uVar16 + 1;
    uVar16 = 0;
    uVar10 = 0;
    do {
      if (3 < n) {
        lVar13 = 0;
        do {
          output[uVar16 + lVar13 + 2] = input[uVar16 * 2 + lVar13 * 2 + 2];
          lVar13 = lVar13 + 1;
        } while (uVar2 - 1 != lVar13);
      }
      if (3 < n) {
        lVar13 = 0;
        do {
          output[(int)lVar13 + (int)lVar9] = pfVar3[lVar13 * 2];
          lVar13 = lVar13 + 1;
        } while (uVar2 - 1 != lVar13);
      }
      uVar10 = uVar10 + 1;
      uVar16 = (ulong)(uint)((int)uVar16 + n);
      pfVar3 = pfVar3 + uVar14 * 2;
      lVar9 = lVar9 + uVar14;
    } while (uVar10 != uVar14);
  }
  if (2 < vec_size) {
    pfVar3 = temp + 2;
    pfVar12 = output + 2;
    lVar9 = (ulong)(uint)vec_size - 2;
    do {
      (*fft_single)(pfVar12,pfVar3,n);
      pfVar3 = pfVar3 + 1;
      pfVar12 = pfVar12 + 1;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  uVar5 = 2;
  if (2 < vec_size) {
    uVar5 = vec_size;
  }
  if ((int)uVar5 < n) {
    uVar16 = (ulong)uVar5;
    pfVar3 = output + uVar16;
    pfVar12 = temp + uVar16;
    do {
      (*fft_multi)(pfVar3,pfVar12,n);
      uVar16 = uVar16 + lVar8;
      pfVar3 = pfVar3 + lVar8;
      pfVar12 = pfVar12 + lVar8;
    } while ((long)uVar16 < lVar17);
  }
  if (0 < n) {
    pfVar3 = temp + 1;
    uVar16 = 0;
    do {
      output[uVar16] = pfVar3[-1];
      output[uVar4 * n + uVar16] = *pfVar3;
      uVar16 = uVar16 + 1;
      pfVar3 = pfVar3 + uVar14;
    } while (uVar14 != uVar16);
  }
  if (3 < n) {
    uVar16 = 2;
    if (2 < (int)uVar4) {
      uVar16 = uVar6;
    }
    local_98 = output + uVar14 + 1;
    uVar2 = uVar14 - 1;
    local_c0 = uVar6 * 4 + uVar2 * uVar14 * 4;
    lVar17 = (uVar2 - uVar6) * uVar14;
    local_b8 = lVar17 * 4 + 8;
    uVar5 = n * uVar1;
    local_a0 = uVar6 * 4 + lVar17 * 4;
    local_a8 = uVar6 * uVar14 * 4 + 8;
    pfVar3 = output + (uVar6 + 1) * uVar14 + 1;
    lVar17 = uVar2 * uVar14 * 4 + 8;
    uVar11 = 1;
    lVar9 = 8;
    uVar10 = (ulong)(uint)n;
    uVar4 = uVar1;
    do {
      local_a0 = local_a0 + 4;
      local_c0 = local_c0 + 4;
      uVar15 = 0;
      pfVar12 = temp;
      do {
        fVar18 = 0.0;
        if (uVar15 < uVar6 && uVar15 != 0) {
          fVar18 = pfVar12[(ulong)uVar4 + uVar6 * uVar14];
        }
        output[uVar10 + uVar15] = fVar18 + *(float *)((long)pfVar12 + lVar9);
        uVar15 = uVar15 + 1;
        pfVar12 = pfVar12 + uVar14;
      } while (uVar1 != uVar15);
      pfVar12 = temp;
      uVar15 = uVar6;
      if ((int)uVar1 < n) {
        do {
          local_98[uVar15] =
               *(float *)((long)pfVar12 + local_b8) - *(float *)((long)pfVar12 + local_c0);
          uVar15 = uVar15 + 1;
          pfVar12 = pfVar12 + -uVar14;
        } while (uVar2 != uVar15);
      }
      uVar15 = 0;
      pfVar12 = temp;
      do {
        fVar18 = 0.0;
        if (uVar15 < uVar6 && uVar15 != 0) {
          fVar18 = *(float *)((long)pfVar12 + local_a8);
        }
        output[uVar5 + uVar15] = pfVar12[uVar4] - fVar18;
        uVar15 = uVar15 + 1;
        pfVar12 = pfVar12 + uVar14;
      } while (uVar1 != uVar15);
      pfVar12 = temp;
      uVar15 = uVar6;
      if ((int)uVar1 < n) {
        do {
          pfVar3[uVar15] = *(float *)((long)pfVar12 + lVar17) + *(float *)((long)pfVar12 + local_a0)
          ;
          uVar15 = uVar15 + 1;
          pfVar12 = pfVar12 + -uVar14;
        } while (uVar2 != uVar15);
      }
      uVar11 = uVar11 + 1;
      uVar10 = (ulong)(uint)((int)uVar10 + n);
      lVar9 = lVar9 + 4;
      uVar4 = uVar4 + 1;
      local_98 = local_98 + uVar14;
      local_b8 = local_b8 + 4;
      uVar5 = uVar5 + n;
      local_a8 = local_a8 + 4;
      pfVar3 = pfVar3 + uVar14;
      lVar17 = lVar17 + 4;
    } while (uVar11 != uVar16);
  }
  if (0 < n) {
    lVar17 = 0;
    pfVar3 = temp;
    pfVar12 = output;
    do {
      (*ifft_multi)(pfVar12,pfVar3,n);
      lVar17 = lVar17 + lVar8;
      pfVar12 = pfVar12 + lVar8;
      pfVar3 = pfVar3 + lVar8;
    } while (lVar17 < (long)uVar14);
  }
  (*transpose)(temp,output,n);
  return;
}

Assistant:

void aom_ifft_2d_gen(const float *input, float *temp, float *output, int n,
                     aom_fft_1d_func_t fft_single, aom_fft_1d_func_t fft_multi,
                     aom_fft_1d_func_t ifft_multi,
                     aom_fft_transpose_func_t transpose, int vec_size) {
  // Column 0 and n/2 have conjugate symmetry, so we can directly do the ifft
  // and get real outputs.
  for (int y = 0; y <= n / 2; ++y) {
    output[y * n] = input[2 * y * n];
    output[y * n + 1] = input[2 * (y * n + n / 2)];
  }
  for (int y = n / 2 + 1; y < n; ++y) {
    output[y * n] = input[2 * (y - n / 2) * n + 1];
    output[y * n + 1] = input[2 * ((y - n / 2) * n + n / 2) + 1];
  }

  for (int i = 0; i < 2; i += vec_size) {
    ifft_multi(output + i, temp + i, n);
  }

  // For the other columns, since we don't have a full ifft for complex inputs
  // we have to split them into the real and imaginary counterparts.
  // Pack the real component, then the imaginary components.
  for (int y = 0; y < n; ++y) {
    for (int x = 1; x < n / 2; ++x) {
      output[y * n + (x + 1)] = input[2 * (y * n + x)];
    }
    for (int x = 1; x < n / 2; ++x) {
      output[y * n + (x + n / 2)] = input[2 * (y * n + x) + 1];
    }
  }
  for (int y = 2; y < vec_size; y++) {
    fft_single(output + y, temp + y, n);
  }
  // This is the part that can be sped up with SIMD
  for (int y = AOMMAX(2, vec_size); y < n; y += vec_size) {
    fft_multi(output + y, temp + y, n);
  }

  // Put the 0 and n/2 th results in the correct place.
  for (int x = 0; x < n; ++x) {
    output[x] = temp[x * n];
    output[(n / 2) * n + x] = temp[x * n + 1];
  }
  // This rearranges and transposes.
  for (int y = 1; y < n / 2; ++y) {
    // Fill in the real columns
    for (int x = 0; x <= n / 2; ++x) {
      output[x + y * n] =
          temp[(y + 1) + x * n] +
          ((x > 0 && x < n / 2) ? temp[(y + n / 2) + (x + n / 2) * n] : 0);
    }
    for (int x = n / 2 + 1; x < n; ++x) {
      output[x + y * n] = temp[(y + 1) + (n - x) * n] -
                          temp[(y + n / 2) + ((n - x) + n / 2) * n];
    }
    // Fill in the imag columns
    for (int x = 0; x <= n / 2; ++x) {
      output[x + (y + n / 2) * n] =
          temp[(y + n / 2) + x * n] -
          ((x > 0 && x < n / 2) ? temp[(y + 1) + (x + n / 2) * n] : 0);
    }
    for (int x = n / 2 + 1; x < n; ++x) {
      output[x + (y + n / 2) * n] = temp[(y + 1) + ((n - x) + n / 2) * n] +
                                    temp[(y + n / 2) + (n - x) * n];
    }
  }
  for (int y = 0; y < n; y += vec_size) {
    ifft_multi(output + y, temp + y, n);
  }
  transpose(temp, output, n);
}